

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  SPxOut *pSVar2;
  bool bVar3;
  int iVar4;
  DataKey DVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  uint *puVar8;
  DataKey local_140;
  Verbosity old_verbosity;
  int iStack_134;
  undefined4 local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_a0 [28];
  int local_30;
  undefined1 local_2c;
  undefined8 local_28;
  
  u = &(this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance;
  pnVar7 = u;
  puVar8 = local_a0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = (pnVar7->m_backend).data._M_elems[0];
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar7->m_backend).data._M_elems + 1);
    puVar8 = puVar8 + 1;
  }
  local_30 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.exp;
  local_2c = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg;
  local_28._0_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_28._4_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  DVar5 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)local_a0);
  local_140 = DVar5;
  if (DVar5.info < 1) {
LAB_00438ec7:
    iVar4 = DVar5.info;
    if (-1 < DVar5.info) goto LAB_00438efb;
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SPxRowId::SPxRowId((SPxRowId *)&old_verbosity,(SPxId *)&local_140);
    bVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic(pSVar1,(SPxRowId *)&old_verbosity);
    if (!bVar3) {
      iVar4 = local_140.info;
      goto LAB_00438efb;
    }
    local_140 = (DataKey)((ulong)local_140 & 0xffffffff00000000);
  }
  else {
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SPxColId::SPxColId((SPxColId *)&old_verbosity,(SPxId *)&local_140);
    bVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic(pSVar1,(SPxColId *)&old_verbosity);
    if (!bVar3) {
      DVar5 = (DataKey)((ulong)local_140 & 0xffffffff);
      goto LAB_00438ec7;
    }
    local_140 = (DataKey)((ulong)local_140 & 0xffffffff00000000);
    iVar4 = 0;
LAB_00438efb:
    if (iVar4 != 0) {
      return (SPxId)local_140;
    }
  }
  if (this->refined != false) {
    return (SPxId)local_140;
  }
  this->refined = true;
  pSVar2 = ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    old_verbosity = pSVar2->m_verbosity;
    local_12c = 5;
    (*pSVar2->_vptr_SPxOut[2])();
    soplex::operator<<(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->spxout,"WDEVEX02 trying refinement step..\n");
    pSVar2 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity);
  }
  old_verbosity = 0;
  iStack_134 = 0x40000000;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&result.m_backend,&u->m_backend,(double *)&old_verbosity);
  DVar5 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result.m_backend);
  local_140 = DVar5;
  if (0 < DVar5.info) {
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SPxColId::SPxColId((SPxColId *)&old_verbosity,(SPxId *)&local_140);
    bVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic(pSVar1,(SPxColId *)&old_verbosity);
    if (bVar3) goto LAB_00439033;
    DVar5 = (DataKey)((ulong)local_140 & 0xffffffff);
  }
  if (-1 < DVar5.info) {
    return (SPxId)local_140;
  }
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  SPxRowId::SPxRowId((SPxRowId *)&old_verbosity,(SPxId *)&local_140);
  bVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::isBasic(pSVar1,(SPxRowId *)&old_verbosity);
  if (!bVar3) {
    return (SPxId)local_140;
  }
LAB_00439033:
  local_140 = (DataKey)((ulong)local_140 & 0xffffffff00000000);
  return (SPxId)local_140;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}